

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O0

LogicalType * BoundedType::Get(int32_t max_val)

{
  pointer this;
  LogicalType *in_RDI;
  templated_unique_single_t info;
  LogicalType *type;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  *puVar1;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  *in_stack_ffffffffffffff40;
  pointer __args;
  LogicalType *this_00;
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
  local_98;
  Value local_90 [95];
  allocator local_31;
  string local_30 [35];
  byte local_d;
  
  local_d = 0;
  this_00 = in_RDI;
  duckdb::LogicalType::LogicalType(in_RDI,INTEGER);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"BOUNDED",&local_31);
  duckdb::LogicalType::SetAlias(this_00,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  duckdb::make_uniq<duckdb::ExtensionTypeInfo>();
  this = duckdb::
         unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
         ::operator->(in_stack_ffffffffffffff40);
  __args = this;
  duckdb::Value::INTEGER((int)local_90);
  std::vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_>::
  emplace_back<duckdb::Value>
            ((vector<duckdb::LogicalTypeModifier,_std::allocator<duckdb::LogicalTypeModifier>_> *)
             this_00,(Value *)__args);
  duckdb::Value::~Value(local_90);
  puVar1 = &local_98;
  duckdb::
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
  unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
              *)this,puVar1);
  duckdb::LogicalType::SetExtensionInfo(this_00,puVar1);
  duckdb::
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
               *)0x15c3d2);
  local_d = 1;
  duckdb::
  unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>,_true>
               *)0x15c3e4);
  if ((local_d & 1) == 0) {
    duckdb::LogicalType::~LogicalType(this_00);
  }
  return in_RDI;
}

Assistant:

static LogicalType Get(int32_t max_val) {
		auto type = LogicalType(LogicalTypeId::INTEGER);
		type.SetAlias("BOUNDED");
		auto info = make_uniq<ExtensionTypeInfo>();
		info->modifiers.emplace_back(Value::INTEGER(max_val));
		type.SetExtensionInfo(std::move(info));
		return type;
	}